

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

int __thiscall obx::ExpiredObjects::remove(ExpiredObjects *this,char *__filename)

{
  int err;
  undefined4 in_EDX;
  size_t removedCount;
  undefined8 local_8;
  
  local_8 = 0;
  if (*(long *)(__filename + 0x10) == 0) {
    internal::throwIllegalStateException("State condition failed: ","cTxn_");
  }
  err = obx_expired_objects_remove(*(long *)(__filename + 0x10),in_EDX,&local_8);
  if (err == 0) {
    return (int)local_8;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

size_t ExpiredObjects::remove(obx::Transaction& tx, obx_schema_id typeId) {
    size_t removedCount = 0;
    obx_err err = obx_expired_objects_remove(tx.cPtr(), typeId, &removedCount);
    internal::checkErrOrThrow(err);
    return removedCount;
}